

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

int __thiscall nuraft::raft_server::shutdown(raft_server *this,int __fd,int __how)

{
  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  *this_00;
  element_type *peVar1;
  context *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  uint uVar5;
  int extraout_EAX;
  nuraft_global_mgr *this_01;
  snapshot_io_mgr *this_02;
  char *extraout_RAX;
  char *extraout_RAX_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  mutex *__mutex;
  unique_lock<std::recursive_mutex> guard;
  ptr<raft_params> params;
  unique_lock<std::mutex> commit_lock;
  undefined1 local_60 [16];
  char local_50 [16];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  mutex *local_30;
  undefined1 local_28;
  char *pcVar6;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])
                      (peVar1,CONCAT44(in_register_00000034,__fd),
                       CONCAT44(in_register_00000014,__how));
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"shutting down raft core");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1bf,(string *)local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  this_01 = nuraft_global_mgr::get_instance();
  if (this_01 != (nuraft_global_mgr *)0x0) {
    nuraft_global_mgr::close_raft_server(this_01,this);
  }
  context::get_params((context *)&stack0xffffffffffffffc0);
  if (*(char *)((long)&local_40[0xc]._vptr_state_mgr + 4) == '\x01') {
    this_02 = snapshot_io_mgr::instance();
    snapshot_io_mgr::drop_reqs(this_02,this);
  }
  local_60._0_8_ = &this->lock_;
  local_60[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_60);
  local_60[8] = true;
  LOCK();
  (this->stopping_)._M_base._M_i = true;
  UNLOCK();
  local_28 = 0;
  local_30 = &this->commit_cv_lock_;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffffd0);
  local_28 = 1;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffffd0);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_60);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"sent stop signal to the commit thread.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1d2,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  cancel_schedulers(this);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"cancelled all schedulers.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1d8,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  if (((this->commit_bg_stopped_)._M_base._M_i & 1U) == 0) {
    do {
      local_60[8] = false;
      local_60._0_8_ = &this->commit_cv_lock_;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
      local_60[8] = true;
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
      sched_yield();
    } while (((this->commit_bg_stopped_)._M_base._M_i & 1U) == 0);
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"commit thread stopped.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1e2,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  drop_all_pending_commit_elems(this);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"all pending commit elements dropped.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1e6,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  __mutex = &((this->ctx_)._M_t.
              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
              super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->ctx_lock_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pcVar2 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  (pcVar2->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var3 = (pcVar2->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pcVar2->logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar2 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  (pcVar2->rpc_listener_).super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var3 = (pcVar2->rpc_listener_).
           super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pcVar2->rpc_listener_).super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar2 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  (pcVar2->rpc_cli_factory_).
  super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var3 = (pcVar2->rpc_cli_factory_).
           super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (pcVar2->rpc_cli_factory_).
  super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar2 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  (pcVar2->scheduler_).
  super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var3 = (pcVar2->scheduler_).
           super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (pcVar2->scheduler_).
  super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"reset all pointers.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1f0,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  if ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    reset_srv_to_join(this);
  }
  if ((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    reset_srv_to_leave(this);
  }
  if ((this->bg_commit_thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"joined terminated commit thread.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x1ff,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  while ((this->bg_append_ea_ != (EventAwaiter *)0x0 &&
         (((this->append_bg_stopped_)._M_base._M_i & 1U) == 0))) {
    EventAwaiter::invoke(this->bg_append_ea_);
    sched_yield();
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_60,"sent stop signal to background append thread.");
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"shutdown",0x206,local_60);
      if ((char *)local_60._0_8_ != local_50) {
        operator_delete((void *)local_60._0_8_);
      }
    }
  }
  if ((this->bg_append_thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->auto_fwd_reqs_lock_);
  if (iVar4 == 0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar4 = (*peVar1->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_60,"clean up auto-forwarding queue: %zu elems",
                   (this->auto_fwd_reqs_).
                   super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                   ._M_impl._M_node._M_size);
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"shutdown",0x20e,local_60);
        if ((char *)local_60._0_8_ != local_50) {
          operator_delete((void *)local_60._0_8_);
        }
      }
    }
    this_00 = &this->auto_fwd_reqs_;
    std::__cxx11::
    _List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
    ::_M_clear(&this_00->
                super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
              );
    (this->auto_fwd_reqs_).
    super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->auto_fwd_reqs_).
    super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->auto_fwd_reqs_).
    super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
    ._M_impl._M_node._M_size = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->auto_fwd_reqs_lock_);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar4 = (*peVar1->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_60,"clean up auto-forwarding clients");
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"shutdown",0x212,local_60);
        if ((char *)local_60._0_8_ != local_50) {
          operator_delete((void *)local_60._0_8_);
        }
      }
    }
    cleanup_auto_fwd_pkgs(this);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar6 = extraout_RAX;
    if (peVar1 != (element_type *)0x0) {
      uVar5 = (*peVar1->_vptr_logger[7])();
      pcVar6 = (char *)(ulong)uVar5;
      if (3 < (int)uVar5) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_60,"raft_server shutdown completed.");
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"shutdown",0x215,local_60);
        pcVar6 = local_50;
        if ((char *)local_60._0_8_ != pcVar6) {
          operator_delete((void *)local_60._0_8_);
          pcVar6 = extraout_RAX_00;
        }
      }
    }
    iVar4 = (int)pcVar6;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      iVar4 = extraout_EAX;
    }
    return iVar4;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void raft_server::shutdown() {
    p_in("shutting down raft core");

    // If the global manager exists, cancel all pending requests.
    cancel_global_requests();

    // Cancel snapshot requests if exist.
    ptr<raft_params> params = ctx_->get_params();
    if (params->use_bg_thread_for_snapshot_io_) {
        snapshot_io_mgr::instance().drop_reqs(this);
    }

    // Terminate background commit thread.
    {   recur_lock(lock_);
        stopping_ = true;
        {   std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
            commit_cv_.notify_all();
        }
    }

    p_in("sent stop signal to the commit thread.");

    // Cancel all scheduler tasks.
    // TODO: how do we guarantee all tasks are done?
    cancel_schedulers();

    p_in("cancelled all schedulers.");

    // Wait until background commit thread terminates.
    while (!commit_bg_stopped_) {
        {   std::unique_lock<std::mutex> commit_lock(commit_cv_lock_);
            commit_cv_.notify_all();
        }
        std::this_thread::yield();
    }

    p_in("commit thread stopped.");

    drop_all_pending_commit_elems();

    p_in("all pending commit elements dropped.");

    // Clear shared_ptrs that the current server is holding.
    {   std::lock_guard<std::mutex> l(ctx_->ctx_lock_);
        ctx_->logger_.reset();
        ctx_->rpc_listener_.reset();
        ctx_->rpc_cli_factory_.reset();
        ctx_->scheduler_.reset();
    }

    p_in("reset all pointers.");

    // Server to join/leave.
    if (srv_to_join_) {
        reset_srv_to_join();
    }
    if (srv_to_leave_) {
        reset_srv_to_leave();
    }

    // Wait for BG commit thread.
    if (bg_commit_thread_.joinable()) {
        bg_commit_thread_.join();
    }

    p_in("joined terminated commit thread.");

    while (bg_append_ea_ && !append_bg_stopped_) {
        bg_append_ea_->invoke();
        std::this_thread::yield();
    }

    p_in("sent stop signal to background append thread.");

    if (bg_append_thread_.joinable()) {
        bg_append_thread_.join();
    }

    {
        auto_lock(auto_fwd_reqs_lock_);
        p_in("clean up auto-forwarding queue: %zu elems", auto_fwd_reqs_.size());
        auto_fwd_reqs_.clear();
    }

    p_in("clean up auto-forwarding clients");
    cleanup_auto_fwd_pkgs();

    p_in("raft_server shutdown completed.");
}